

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O1

void reset_outdoors(tgestate_t *state)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  
  iVar2 = *(int *)&state->vischars[0].mi.mappos;
  iVar3 = *(int *)&state->vischars[0].mi.mappos.w;
  *(int *)&state->saved_mappos = iVar2;
  (state->saved_mappos).pos16.w = (uint16_t)iVar3;
  uVar4 = (uint)(state->saved_mappos).pos16.v;
  uVar1 = (uVar4 - iVar2) * 2 + 0x400;
  state->vischars[0].isopos.x = (uint16_t)uVar1;
  uVar4 = 0x800 - (iVar2 + uVar4 + iVar3);
  state->vischars[0].isopos.y = (uint16_t)uVar4;
  (state->map_position).x = (char)(uVar1 >> 3) + 0xf5;
  (state->map_position).y = (char)(uVar4 >> 3) + 0xfa;
  state->room_index = '\0';
  get_supertiles(state);
  plot_all_tiles(state);
  setup_movable_items(state);
  zoombox(state);
  return;
}

Assistant:

void reset_outdoors(tgestate_t *state)
{
  assert(state != NULL);

  /* Reset hero. */
  calc_vischar_isopos_from_vischar(state, &state->vischars[0]);

  /* Centre the map position on the hero. */
  /* Conv: Removed divide_by_8 calls here. */
  state->map_position.x = (state->vischars[0].isopos.x >> 3) - 11; // 11 would be screen width minus half of character width?
  state->map_position.y = (state->vischars[0].isopos.y >> 3) - 6;  // 6 would be screen height minus half of character height?
  ASSERT_MAP_POSITION_VALID(state->map_position);

  state->room_index = room_0_OUTDOORS;
  get_supertiles(state);
  plot_all_tiles(state);
  setup_movable_items(state);
  zoombox(state);
}